

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdpp.h
# Opt level: O3

bool __thiscall GD::Image::CreateFromPng(Image *this,istream *in)

{
  gdImagePtr pgVar1;
  istreamIOCtx _in_ctx;
  gdIOCtx local_58;
  istream *local_18;
  
  if (*(gdImagePtr *)this != (gdImagePtr)0x0) {
    gdImageDestroy(*(gdImagePtr *)this);
  }
  *(undefined8 *)this = 0;
  local_58.getC = istreamIOCtx::Getchar;
  local_58.putC = istreamIOCtx::Putchar;
  local_58.getBuf = istreamIOCtx::Getbuf;
  local_58.putBuf = istreamIOCtx::Putbuf;
  local_58.tell = istreamIOCtx::Tell;
  local_58.seek = istreamIOCtx::Seek;
  local_58.gd_free = istreamIOCtx::FreeCtx;
  local_18 = in;
  pgVar1 = gdImageCreateFromPngCtx(&local_58);
  *(gdImagePtr *)this = pgVar1;
  return pgVar1 != (gdImagePtr)0x0;
}

Assistant:

bool CreateFromPng(std::istream & in) {
		clear();
		istreamIOCtx _in_ctx(in);
		return ((im = gdImageCreateFromPngCtx( & _in_ctx)) != 0);
	}